

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isCompleted(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,int index)

{
  bool bVar1;
  byte bVar2;
  iterator fnd;
  lock_guard<std::mutex> lock;
  map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  _Self local_38 [3];
  _Self local_20 [4];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
             ,(mutex_type *)in_stack_ffffffffffffffa8);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type_conflict1 *)0x4c40cb);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(local_20,local_38);
  bVar2 = bVar1 ^ 0xff;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4c4111);
  return (bool)(bVar2 & 1);
}

Assistant:

bool isCompleted(int index)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByInteger.find(index);
        return (fnd != usedPromiseByInteger.end());
    }